

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void * ggml_aligned_malloc(size_t size)

{
  int iVar1;
  size_t in_RDI;
  undefined1 auVar2 [16];
  char *error_desc;
  int result;
  void *aligned_memory;
  int alignment;
  char *local_30;
  void *local_20;
  undefined4 local_14;
  size_t local_10;
  void *local_8;
  
  local_14 = 0x40;
  if (in_RDI == 0) {
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_aligned_malloc!\n"
                     );
    local_8 = (void *)0x0;
  }
  else {
    local_20 = (void *)0x0;
    local_10 = in_RDI;
    iVar1 = posix_memalign(&local_20,0x40,in_RDI);
    if (iVar1 == 0) {
      local_8 = local_20;
    }
    else {
      local_30 = "unknown allocation error";
      if (iVar1 == 0xc) {
        local_30 = "insufficient memory";
      }
      else if (iVar1 == 0x16) {
        local_30 = "invalid alignment value";
      }
      auVar2._8_4_ = (int)(local_10 >> 0x20);
      auVar2._0_8_ = local_10;
      auVar2._12_4_ = 0x45300000;
      ggml_log_internal((ggml_log_level)
                        (((auVar2._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) /
                        1048576.0),(char *)0x4,"%s: %s (attempted to allocate %6.2f MB)\n",
                        "ggml_aligned_malloc",local_30);
      local_8 = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

void * ggml_aligned_malloc(size_t size) {
#if defined(__s390x__)
    const int alignment = 256;
#else
    const int alignment = 64;
#endif

#if defined(_MSC_VER) || defined(__MINGW32__)
    return _aligned_malloc(size, alignment);
#else
    if (size == 0) {
        GGML_LOG_WARN("Behavior may be unexpected when allocating 0 bytes for ggml_aligned_malloc!\n");
        return NULL;
    }
    void * aligned_memory = NULL;
  #ifdef GGML_USE_CPU_HBM
    int result = hbw_posix_memalign(&aligned_memory, alignment, size);
  #elif TARGET_OS_OSX
    GGML_UNUSED(alignment);
    kern_return_t alloc_status = vm_allocate((vm_map_t) mach_task_self(), (vm_address_t *) &aligned_memory, size, VM_FLAGS_ANYWHERE);
    int result = EFAULT;
    switch (alloc_status) {
        case KERN_SUCCESS:
            result = 0;
            break;
        case KERN_INVALID_ADDRESS:
            result = EINVAL;
            break;
        case KERN_NO_SPACE:
            result = ENOMEM;
            break;
        default:
            result = EFAULT;
            break;
    }
  #else
    int result = posix_memalign(&aligned_memory, alignment, size);
  #endif
    if (result != 0) {
        // Handle allocation failure
        const char *error_desc = "unknown allocation error";
        switch (result) {
            case EINVAL:
                error_desc = "invalid alignment value";
                break;
            case ENOMEM:
                error_desc = "insufficient memory";
                break;
        }
        GGML_LOG_ERROR("%s: %s (attempted to allocate %6.2f MB)\n", __func__, error_desc, size/(1024.0*1024.0));
        return NULL;
    }
    return aligned_memory;
#endif
}